

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O1

void dlist_add_after(dlnode *node1,dlnode *node2)

{
  if (node2 != (dlnode *)0x0 && node1 != (dlnode *)0x0) {
    node2->prev = node1;
    node2->next = node1->next;
    node1->next->prev = node2;
    node1->next = node2;
  }
  return;
}

Assistant:

void dlist_add_after(dlnode *node1, dlnode *node2) {
    if (!node1 || !node2) {
        return;
    }

    node2->prev = node1;
    node2->next = node1->next;
    node1->next->prev = node2;
    node1->next = node2;
}